

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_deleglise_rivat_parallel1.cpp
# Opt level: O2

int256_t * __thiscall
primesum::pi_deleglise_rivat_parallel1
          (int256_t *__return_storage_ptr__,primesum *this,int128_t x,int threads)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  undefined1 x_03 [16];
  undefined1 x_04 [16];
  undefined1 x_05 [16];
  undefined1 x_06 [16];
  undefined1 x_07 [16];
  undefined1 x_08 [16];
  primesum *ppVar3;
  __int128 *p_Var4;
  int64_t c;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  primesum_error *this_00;
  undefined4 in_ECX;
  long lVar10;
  undefined4 in_register_00000014;
  primesum *this_01;
  long extraout_RDX;
  undefined8 extraout_RDX_00;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int threads_00;
  int128_t *__return_storage_ptr___00;
  bool bVar14;
  double alpha;
  double dVar15;
  undefined4 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedc [12];
  int256_t phi;
  int256_t s2_easy;
  int256_t s2_hard;
  int256_t s1;
  int256_t p2;
  string limit;
  
  this_01 = (primesum *)CONCAT44(in_register_00000014,threads);
  if (-(long)this_01 < (long)(ulong)((primesum *)0x1 < this)) {
    x_00._4_12_ = in_stack_fffffffffffffedc;
    x_00._0_4_ = in_stack_fffffffffffffed8;
    ppVar3 = this_01;
    alpha = get_alpha_deleglise_rivat(this,(int128_t)x_00);
    get_max_x_abi_cxx11_(&limit,ppVar3,alpha);
    ppVar3 = (primesum *)to_int128(&limit);
    if ((SBORROW8(extraout_RDX,(long)this_01) !=
        SBORROW8(extraout_RDX - (long)this_01,(ulong)(ppVar3 < this))) !=
        (long)((extraout_RDX - (long)this_01) - (ulong)(ppVar3 < this)) < 0) {
      this_00 = (primesum_error *)__cxa_allocate_exception(0x10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&phi,
                     "pi(x): x must be <= ",&limit);
      primesum_error::primesum_error(this_00,(string *)&phi);
      __cxa_throw(this_00,&primesum_error::typeinfo,std::runtime_error::~runtime_error);
    }
    x_01._4_12_ = in_stack_fffffffffffffedc;
    x_01._0_4_ = in_stack_fffffffffffffed8;
    p_Var4 = iroot<3,__int128>((__int128 *)this,this_01,(__int128)x_01);
    dVar15 = (double)__floattidf(p_Var4,extraout_RDX_00);
    __return_storage_ptr___00 = (int128_t *)(long)(dVar15 * alpha);
    c = __divti3(this,this_01,__return_storage_ptr___00,(long)__return_storage_ptr___00 >> 0x3f);
    if ((long)__return_storage_ptr___00 < 0xd) {
      threads_00 = *(int *)(PhiTiny::pi + (long)__return_storage_ptr___00 * 4);
    }
    else {
      threads_00 = 6;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&phi,"",(allocator<char> *)&s2_easy);
    print((string *)&phi);
    std::__cxx11::string::~string((string *)&phi);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&phi,"=== pi_deleglise_rivat_parallel1(x) ===",(allocator<char> *)&s2_easy)
    ;
    print((string *)&phi);
    std::__cxx11::string::~string((string *)&phi);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&phi,"pi(x) = S1 + S2 + pi(y) - 1 - P2",(allocator<char> *)&s2_easy);
    print((string *)&phi);
    std::__cxx11::string::~string((string *)&phi);
    x_02._4_12_ = in_stack_fffffffffffffedc;
    x_02._0_4_ = in_stack_fffffffffffffed8;
    print(this,(int128_t)x_02,(int64_t)this_01,(int64_t)__return_storage_ptr___00,c,alpha,threads_00
         );
    x_03._4_12_ = in_stack_fffffffffffffedc;
    x_03._0_4_ = in_stack_fffffffffffffed8;
    P2(&p2,this,(int128_t)x_03,(int64_t)this_01,(int)__return_storage_ptr___00);
    x_04._4_12_ = in_stack_fffffffffffffedc;
    x_04._0_4_ = in_stack_fffffffffffffed8;
    S1(&s1,this,(int128_t)x_04,(int64_t)this_01,(int64_t)__return_storage_ptr___00,threads_00);
    x_05._4_12_ = in_stack_fffffffffffffedc;
    x_05._0_4_ = in_ECX;
    S2_trivial(&phi,this,(int128_t)x_05,(int64_t)this_01,(int64_t)__return_storage_ptr___00,c,
               threads_00);
    x_06._4_12_ = in_stack_fffffffffffffedc;
    x_06._0_4_ = in_ECX;
    S2_easy(&s2_easy,this,(int128_t)x_06,(int64_t)this_01,(int64_t)__return_storage_ptr___00,c,
            threads_00);
    x_07._4_12_ = in_stack_fffffffffffffedc;
    x_07._0_4_ = in_ECX;
    S2_hard(&s2_hard,this,(int128_t)x_07,(int64_t)this_01,(int64_t)__return_storage_ptr___00,c,
            threads_00);
    bVar14 = CARRY8((ulong)s2_easy.high,(ulong)phi.high);
    uVar5 = (ulong)s2_easy.high + (ulong)phi.high;
    uVar6 = uVar5 + (ulong)s2_hard.high;
    uVar12 = s2_easy.low._8_8_ + phi.low._8_8_ + (ulong)CARRY8((ulong)s2_easy.low,(ulong)phi.low);
    uVar1 = (ulong)(CARRY8(s2_easy.low._8_8_,phi.low._8_8_) ||
                   CARRY8(s2_easy.low._8_8_ + phi.low._8_8_,
                          (ulong)CARRY8((ulong)s2_easy.low,(ulong)phi.low)));
    uVar7 = uVar6 + uVar1;
    uVar11 = (ulong)s2_easy.low + (ulong)phi.low + (ulong)s2_hard.low;
    uVar2 = (ulong)CARRY8((ulong)s2_easy.low + (ulong)phi.low,(ulong)s2_hard.low);
    uVar8 = uVar12 + s2_hard.low._8_8_;
    uVar13 = uVar8 + uVar2;
    uVar2 = (ulong)(CARRY8(uVar12,s2_hard.low._8_8_) || CARRY8(uVar8,uVar2));
    uVar8 = uVar7 + uVar2;
    phi.high._0_8_ = uVar8 + (ulong)s1.high;
    phi.high._8_8_ =
         s2_easy.high._8_8_ + phi.high._8_8_ + (ulong)bVar14 + s2_hard.high._8_8_ +
         (ulong)CARRY8(uVar5,(ulong)s2_hard.high) + (ulong)CARRY8(uVar6,uVar1) +
         (ulong)CARRY8(uVar7,uVar2) + s1.high._8_8_ + (ulong)CARRY8(uVar8,(ulong)s1.high);
    phi.low._0_8_ = uVar11 + (ulong)s1.low;
    uVar1 = (ulong)CARRY8(uVar11,(ulong)s1.low);
    uVar2 = uVar13 + s1.low._8_8_;
    phi.low._8_8_ = uVar2 + uVar1;
    if (CARRY8(uVar13,s1.low._8_8_) || CARRY8(uVar2,uVar1)) {
      bVar14 = 0xfffffffffffffffe < (ulong)phi.high;
      phi.high._0_8_ = (ulong)phi.high + 1;
      phi.high._8_8_ = phi.high._8_8_ + (ulong)bVar14;
    }
    prime_sum_tiny(__return_storage_ptr___00,phi.low._8_8_);
    x_08._4_12_ = in_stack_fffffffffffffedc;
    x_08._0_4_ = in_ECX;
    int256_t::operator+(&s2_hard,&phi,(__int128)x_08);
    int256_t::operator-(&s2_easy,&s2_hard,1);
    lVar9 = (ulong)s2_easy.high - (ulong)p2.high;
    lVar10 = (s2_easy.high._8_8_ - p2.high._8_8_) - (ulong)((ulong)s2_easy.high < (ulong)p2.high);
    *(long *)((long)&__return_storage_ptr__->high + 8) = lVar10;
    *(long *)&__return_storage_ptr__->high = lVar9;
    *(ulong *)&__return_storage_ptr__->low = (ulong)s2_easy.low - (ulong)p2.low;
    *(ulong *)((long)&__return_storage_ptr__->low + 8) =
         (s2_easy.low._8_8_ - p2.low._8_8_) - (ulong)((ulong)s2_easy.low < (ulong)p2.low);
    if (s2_easy.low._8_8_ < p2.low._8_8_ ||
        s2_easy.low._8_8_ - p2.low._8_8_ < (ulong)((ulong)s2_easy.low < (ulong)p2.low)) {
      *(long *)&__return_storage_ptr__->high = lVar9 + -1;
      *(ulong *)((long)&__return_storage_ptr__->high + 8) = lVar10 + -1 + (ulong)(lVar9 != 0);
    }
    std::__cxx11::string::~string((string *)&limit);
  }
  else {
    *(undefined8 *)&__return_storage_ptr__->high = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->high + 8) = 0;
    *(undefined8 *)&__return_storage_ptr__->low = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->low + 8) = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

int256_t pi_deleglise_rivat_parallel1(int128_t x, int threads)
{
  if (x < 2)
    return 0;

  double alpha = get_alpha_deleglise_rivat(x);
  string limit = get_max_x(alpha);

  if (x > to_int128(limit))
    throw primesum_error("pi(x): x must be <= " + limit);

  int64_t y = (int64_t) (iroot<3>(x) * alpha);
  int64_t z = (int64_t) (x / y);
  int64_t c = PhiTiny::get_c(y);

  print("");
  print("=== pi_deleglise_rivat_parallel1(x) ===");
  print("pi(x) = S1 + S2 + pi(y) - 1 - P2");
  print(x, y, z, c, alpha, threads);

  int256_t p2 = P2(x, y, threads);
  int256_t s1 = S1(x, y, c, threads);
  int256_t s2 = S2(x, y, z, c, threads);
  int256_t phi = s1 + s2;
  int256_t sum = phi + prime_sum_tiny(y) - 1 - p2;

  return sum;
}